

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O0

void __thiscall
TPZDohrSubstruct<std::complex<double>_>::PrepareSystems
          (TPZDohrSubstruct<std::complex<double>_> *this)

{
  bool bVar1;
  int64_t iVar2;
  TPZBaseMatrix *this_00;
  long lVar3;
  long newRows;
  TPZFMatrix<std::complex<double>_> *pTVar4;
  complex<double> *pcVar5;
  long lVar6;
  TPZMatrix<std::complex<double>_> *this_01;
  TPZFMatrix<std::complex<double>_> *this_02;
  TPZFMatrix<std::complex<double>_> *obj;
  int64_t iVar7;
  TPZAutoPointer<TPZBaseMatrix> *this_03;
  TPZAutoPointer<TPZBaseMatrix> *Refmat;
  TPZMatrixSolver<std::complex<double>_> *this_04;
  TPZStepSolver<std::complex<double>_> *this_05;
  long in_RDI;
  TPZFMatrix<std::complex<double>_> *temp1;
  TPZFMatrix<std::complex<double>_> C_star_trans;
  int i;
  TPZFMatrix<std::complex<double>_> I_star;
  iterator it;
  int count;
  TPZFMatrix<std::complex<double>_> KeC;
  TPZFMatrix<std::complex<double>_> C_transposed;
  int ncoarse;
  undefined4 in_stack_fffffffffffffbd8;
  DecomposeType in_stack_fffffffffffffbdc;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffbe0;
  int64_t in_stack_fffffffffffffbf0;
  int64_t in_stack_fffffffffffffbf8;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc00;
  TPZMatrix<std::complex<double>_> *in_stack_fffffffffffffc18;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc20;
  int64_t in_stack_fffffffffffffc40;
  int64_t in_stack_fffffffffffffc48;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc50;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc58;
  int64_t in_stack_fffffffffffffc60;
  int64_t in_stack_fffffffffffffc88;
  int64_t in_stack_fffffffffffffc90;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffd54;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffd58;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffd60;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffd70;
  complex<double> in_stack_fffffffffffffd78;
  complex<double> in_stack_fffffffffffffd88;
  int local_1fc;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe88;
  TPZFMatrix<std::complex<double>_> *in_stack_fffffffffffffe90;
  _Self in_stack_fffffffffffffe98;
  iterator in_stack_fffffffffffffea0;
  _Self local_158;
  int local_14c;
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_> local_148 [39];
  int local_c;
  
  iVar2 = TPZVec<int>::NElements((TPZVec<int> *)(in_RDI + 0x490));
  local_c = (int)iVar2;
  TPZBaseMatrix::Cols((TPZBaseMatrix *)(in_RDI + 0x2e0));
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x2e0));
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  TPZFMatrix<std::complex<double>_>::Transpose(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  TPZStepSolver<std::complex<double>_>::Solve
            ((TPZStepSolver<std::complex<double>_> *)in_stack_fffffffffffffea0._M_node,
             (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffe98._M_node,
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  TPZStepSolver<std::complex<double>>::Singular_abi_cxx11_
            ((TPZStepSolver<std::complex<double>> *)(in_RDI + 0x648));
  std::__cxx11::list<long,_std::allocator<long>_>::size
            ((list<long,_std::allocator<long>_> *)in_stack_fffffffffffffbe0);
  TPZMatrixSolver<std::complex<double>_>::Matrix
            ((TPZMatrixSolver<std::complex<double>_> *)
             CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
  this_00 = &TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::operator->(local_148)->
             super_TPZBaseMatrix;
  TPZBaseMatrix::Cols(this_00);
  TPZFMatrix<std::complex<double>_>::Resize
            (in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)in_stack_fffffffffffffbe0);
  TPZFMatrix<std::complex<double>_>::Zero(in_stack_fffffffffffffbe0);
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  if (iVar2 != 0) {
    local_14c = 0;
    TPZStepSolver<std::complex<double>>::Singular_abi_cxx11_
              ((TPZStepSolver<std::complex<double>> *)(in_RDI + 0x648));
    local_158._M_node =
         (_List_node_base *)
         std::__cxx11::list<long,_std::allocator<long>_>::begin
                   ((list<long,_std::allocator<long>_> *)
                    CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
    while( true ) {
      TPZStepSolver<std::complex<double>>::Singular_abi_cxx11_
                ((TPZStepSolver<std::complex<double>> *)(in_RDI + 0x648));
      in_stack_fffffffffffffea0 =
           std::__cxx11::list<long,_std::allocator<long>_>::end
                     ((list<long,_std::allocator<long>_> *)
                      CONCAT44(in_stack_fffffffffffffbdc,in_stack_fffffffffffffbd8));
      bVar1 = std::operator!=(&local_158,(_Self *)&stack0xfffffffffffffea0);
      if (!bVar1) break;
      std::_List_iterator<long>::operator*((_List_iterator<long> *)0x200641e);
      pcVar5 = TPZFMatrix<std::complex<double>_>::operator()
                         (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                          in_stack_fffffffffffffbf0);
      std::complex<double>::operator=(pcVar5,1.0);
      in_stack_fffffffffffffe98 = std::_List_iterator<long>::operator++(&local_158,0);
      local_14c = local_14c + 1;
    }
  }
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,in_stack_fffffffffffffc40);
  TPZFMatrix<std::complex<double>_>::Zero(in_stack_fffffffffffffbe0);
  local_1fc = local_c;
  while( true ) {
    lVar3 = (long)local_1fc;
    newRows = (long)local_c;
    pTVar4 = (TPZFMatrix<std::complex<double>_> *)
             TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
    if ((long)&((TPZFMatrix<std::complex<double>_> *)
               (&((TPZFMatrix<std::complex<double>_> *)
                 (&((TPZFMatrix<std::complex<double>_> *)(&pTVar4->fPivot + -1))->fPivot + -1))->
                 fPivot + -1))->fPivot + newRows + 0xffffffffffffffc8U <= lVar3) break;
    pcVar5 = TPZFMatrix<std::complex<double>_>::operator()
                       (in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,
                        in_stack_fffffffffffffbf0);
    std::complex<double>::operator=(pcVar5,1.0);
    local_1fc = local_1fc + 1;
  }
  lVar6 = in_RDI + 8;
  this_01 = (TPZMatrix<std::complex<double>_> *)(long)local_c;
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  TPZFMatrix<std::complex<double>_>::Resize(pTVar4,newRows,lVar3);
  TPZMatrix<std::complex<double>_>::PutSub
            (this_01,lVar6,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  TPZMatrix<std::complex<double>_>::PutSub
            (this_01,lVar6,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  lVar6 = in_RDI + 0x98;
  this_02 = (TPZFMatrix<std::complex<double>_> *)(long)*(int *)(in_RDI + 0x2b8);
  TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  TPZFMatrix<std::complex<double>_>::Resize(pTVar4,newRows,lVar3);
  iVar2 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(this_02,lVar6,iVar2);
  TPZFMatrix<std::complex<double>_>::Transpose(in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  TPZStepSolver<std::complex<double>_>::Solve
            ((TPZStepSolver<std::complex<double>_> *)in_stack_fffffffffffffea0._M_node,
             (TPZFMatrix<std::complex<double>_> *)in_stack_fffffffffffffe98._M_node,
             in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  obj = (TPZFMatrix<std::complex<double>_> *)operator_new(0x90);
  lVar3 = (long)local_c;
  iVar7 = TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  this_03 = (TPZAutoPointer<TPZBaseMatrix> *)(lVar3 + iVar7);
  Refmat = (TPZAutoPointer<TPZBaseMatrix> *)(long)local_c;
  this_04 = (TPZMatrixSolver<std::complex<double>_> *)
            TPZBaseMatrix::Rows((TPZBaseMatrix *)(in_RDI + 0x228));
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(this_02,lVar6,iVar2);
  pTVar4 = obj;
  std::complex<double>::complex((complex<double> *)&stack0xfffffffffffffd58,-1.0,0.0);
  std::complex<double>::complex((complex<double> *)&stack0xfffffffffffffd48,1.0,0.0);
  TPZFMatrix<std::complex<double>_>::MultAdd
            (in_stack_fffffffffffffd70,pTVar4,in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             in_stack_fffffffffffffd88,in_stack_fffffffffffffd78,in_stack_fffffffffffffd54);
  this_05 = (TPZStepSolver<std::complex<double>_> *)(in_RDI + 0x128);
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZFMatrix<std::complex<double>>>(this_03,obj);
  TPZMatrixSolver<std::complex<double>_>::SetMatrix(this_04,Refmat);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer((TPZAutoPointer<TPZBaseMatrix> *)this_05);
  TPZStepSolver<std::complex<double>_>::SetDirect(this_05,in_stack_fffffffffffffbdc);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x20069df);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x20069ec);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x20069f9);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix((TPZFMatrix<std::complex<double>_> *)0x2006a06);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::PrepareSystems() {
	int ncoarse = fCoarseIndex.NElements();
	//TPZFMatrix<TVar> C_transposed;
	/****************************************
	 * TEMPORARIO!!!!!!!!!!!!!!
	 */
	//  int nc = fC.Cols();
	//  fC.Redim(1,nc);
	//  fC(0,nc-1) = 1.;
	
	/*
	 *******************************************/
	/** Tou mantendo isso abaixo só pra fatoracao de K ser TVarizada e se obter os pivos nulos (caso haja) */
	
	//  ofstream out("saida.nb");
	//  this->fStiffness->Print("fK = ",out,EMathematicaInput);
	//  fC.Print("fCi = ",out,EMathematicaInput);
	TPZFMatrix<TVar> C_transposed(fC.Cols(),fC.Rows());
	fC.Transpose(&C_transposed);
	//Ke_inv*C(i)_trans
	TPZFMatrix<TVar> KeC(fNEquations,ncoarse);
	fInvertedStiffness.Solve(C_transposed,KeC);
	/** */
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Number of zero pivots of the substructure : " << fInvertedStiffness.Singular().size();
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	//  std::cout << KeC;
	//  int neq = fInvertedStiffness.Matrix()->Rows();
	//Constructing C barra = NullPivots
	fNullPivots.Resize(fInvertedStiffness.Singular().size(),fInvertedStiffness.Matrix()->Cols());
	fNullPivots.Zero();
	//  fEigenVectors.Redim(fInvertedStiffness.Matrix()->Rows(),fInvertedStiffness.Singular().size());
	if(fNullPivots.Rows())
	{
		//    out << "NullPivots = {";
		int count = 0;
		std::list<int64_t>::iterator it = fInvertedStiffness.Singular().begin();
		for(;it != fInvertedStiffness.Singular().end(); it++,count++)
		{
			//      out << *it;
			//      if(count < fInvertedStiffness.Singular().size()-1) out << ",";
			fNullPivots(count,*it) = 1.;
		}
		//    out << "};\n";
		//    fInvertedStiffness.Solve(fEigenVectors,fEigenVectors);
	}
	//  NullPivots.Print("fNullPivots = ",out,EMathematicaInput);
	
	//Constructing I star
	TPZFMatrix<TVar> I_star(ncoarse+fNullPivots.Rows(),ncoarse+fNullPivots.Rows());
	I_star.Zero();
	int i;
	for (i=ncoarse;i<ncoarse+fNullPivots.Rows();i++) {
		I_star(i,i)=1;
	}
	//Constructing C_star and storing in fC_star
	fC_star.Resize(ncoarse+fNullPivots.Rows(),fNEquations);
	fC_star.PutSub(0,0,fC);
	fC_star.PutSub(ncoarse,0,fNullPivots);
	//  C_star.Print("CStar = ",out,EMathematicaInput);
	//constructing K_star_inv*C_star_trans and storing it in fKeC_star
	fKeC_star.Resize(fNEquations,ncoarse+fNullPivots.Rows());
	TPZFMatrix<TVar> C_star_trans(fNEquations,ncoarse+fNullPivots.Rows());
	fC_star.Transpose(&C_star_trans);
	fInvertedStiffness.Solve(C_star_trans,fKeC_star);
	//Constructing StepSolver finv
	TPZFMatrix<TVar> *temp1 = new TPZFMatrix<TVar>(ncoarse+fNullPivots.Rows(),ncoarse+fNullPivots.Rows());
	fC_star.MultAdd(fKeC_star,I_star,*temp1,-1,1,0);
	finv.SetMatrix(temp1);
	finv.SetDirect(ELU);
}